

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

tribool __thiscall
libtorrent::aux::torrent::on_blocks_hashed
          (torrent *this,piece_index_t piece,span<const_libtorrent::digest32<256L>_> block_hashes)

{
  bool *pbVar1;
  hash_picker *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  file_storage *this_01;
  bool *pbVar7;
  bool *pbVar8;
  long lVar9;
  _Vector_base<int,_std::allocator<int>_> *p_Var10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  piece_index_t pVar14;
  uint uVar15;
  bool *pbVar16;
  set_block_hash_result sVar17;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  undefined1 local_a8 [8];
  alloca_destructor<bool> block_passed_destructor;
  value_t local_48;
  undefined1 local_31;
  
  p_Var10 = &local_c8;
  need_hash_picker(this);
  this_01 = torrent_info::orig_files
                      ((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  uVar4 = file_storage::blocks_in_piece2(this_01,piece);
  iVar5 = file_storage::blocks_per_piece
                    (&((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files);
  pbVar16 = (bool *)(long)(int)uVar4;
  if ((int)uVar4 < 0x1001) {
    if ((int)uVar4 < 1) {
      pbVar16 = (bool *)0x0;
      pbVar7 = (bool *)0x0;
    }
    else {
      p_Var10 = (_Vector_base<int,_std::allocator<int>_> *)
                ((long)&local_c8 - ((ulong)(pbVar16 + 0xf) & 0x1fffffff0));
      pbVar7 = (bool *)p_Var10;
    }
  }
  else {
    pbVar7 = (bool *)operator_new__((ulong)pbVar16);
    p_Var10 = &local_c8;
  }
  local_a8 = (undefined1  [8])pbVar7;
  block_passed_destructor.objects.m_ptr = pbVar16;
  pbVar1 = pbVar7 + (long)pbVar16;
  for (pbVar8 = (bool *)0x0; pbVar16 != pbVar8; pbVar8 = pbVar8 + 1) {
    pbVar7[(long)pbVar8] = false;
  }
  lVar9 = 0;
  block_passed_destructor.objects.m_len = 0;
  if (0 < (int)uVar4) {
    block_passed_destructor.objects.m_len = (difference_type)uVar4;
  }
  *(bool *)((long)p_Var10 + -8) = true;
  *(bool *)((long)p_Var10 + -7) = false;
  *(bool *)((long)p_Var10 + -6) = false;
  *(bool *)((long)p_Var10 + -5) = false;
  *(bool *)((long)p_Var10 + -4) = false;
  *(bool *)((long)p_Var10 + -3) = false;
  *(bool *)((long)p_Var10 + -2) = false;
  *(bool *)((long)p_Var10 + -1) = false;
  local_48 = (value_t)*(undefined8 *)((long)p_Var10 + -8);
  *(bool *)((long)p_Var10 + -8) = true;
  *(bool *)((long)p_Var10 + -7) = false;
  *(bool *)((long)p_Var10 + -6) = false;
  *(bool *)((long)p_Var10 + -5) = false;
  *(bool *)((long)p_Var10 + -4) = false;
  *(bool *)((long)p_Var10 + -3) = false;
  *(bool *)((long)p_Var10 + -2) = false;
  *(bool *)((long)p_Var10 + -1) = false;
  sVar17.num_verified = 0;
  sVar17._0_8_ = *(ulong *)((long)p_Var10 + -8);
  for (; lVar9 != block_passed_destructor.objects.m_len; lVar9 = lVar9 + 1) {
    *(bool *)((long)p_Var10 + -8) = true;
    *(bool *)((long)p_Var10 + -7) = true;
    *(bool *)((long)p_Var10 + -6) = true;
    *(bool *)((long)p_Var10 + -5) = false;
    *(bool *)((long)p_Var10 + -4) = false;
    *(bool *)((long)p_Var10 + -3) = false;
    *(bool *)((long)p_Var10 + -2) = false;
    *(bool *)((long)p_Var10 + -1) = false;
    bVar3 = digest32<256L>::is_all_zeros(block_hashes.m_ptr + lVar9);
    if (bVar3) goto LAB_002d5e5a;
    this_00 = (this->super_torrent_hot_members).m_hash_picker._M_t.
              super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
              .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
    *(bool *)((long)p_Var10 + -8) = true;
    *(bool *)((long)p_Var10 + -7) = true;
    *(bool *)((long)p_Var10 + -6) = true;
    *(bool *)((long)p_Var10 + -5) = false;
    *(bool *)((long)p_Var10 + -4) = false;
    *(bool *)((long)p_Var10 + -3) = false;
    *(bool *)((long)p_Var10 + -2) = false;
    *(bool *)((long)p_Var10 + -1) = false;
    sVar17 = hash_picker::set_block_hash(this_00,piece,(int)lVar9 << 0xe,block_hashes.m_ptr + lVar9)
    ;
    iVar6 = sVar17.num_verified;
    if (sVar17.status == block_hash_failed) {
      local_48 = false_value;
    }
    else if (sVar17.status == success) {
      uVar15 = sVar17.first_verified_block;
      uVar12 = 0;
      if (uVar15 != 0 && -1 < (long)sVar17._0_8_) {
        uVar12 = (ulong)uVar15;
      }
      iVar11 = uVar4 - (int)uVar12;
      if (iVar6 < iVar11) {
        iVar11 = iVar6;
      }
      local_31 = 1;
      *(bool *)((long)p_Var10 + -8) = true;
      *(bool *)((long)p_Var10 + -7) = true;
      *(bool *)((long)p_Var10 + -6) = true;
      *(bool *)((long)p_Var10 + -5) = false;
      *(bool *)((long)p_Var10 + -4) = false;
      *(bool *)((long)p_Var10 + -3) = false;
      *(bool *)((long)p_Var10 + -2) = false;
      *(bool *)((long)p_Var10 + -1) = false;
      ::std::__fill_n_a<bool*,int,bool>(pbVar7 + uVar12,iVar11,&local_31);
      iVar13 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | sVar17._0_8_ >> 0x20) /
                    (long)iVar5);
      for (iVar11 = 0; iVar6 / iVar5 != iVar11; iVar11 = iVar11 + 1) {
        _Var2._M_head_impl =
             (this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
        if ((_Var2._M_head_impl != (piece_picker *)0x0) && (-iVar13 != iVar11)) {
          pVar14.m_val = piece.m_val + iVar13 + iVar11;
          *(bool *)((long)p_Var10 + -8) = true;
          *(bool *)((long)p_Var10 + -7) = true;
          *(bool *)((long)p_Var10 + -6) = true;
          *(bool *)((long)p_Var10 + -5) = false;
          *(bool *)((long)p_Var10 + -4) = false;
          *(bool *)((long)p_Var10 + -3) = false;
          *(bool *)((long)p_Var10 + -2) = false;
          *(bool *)((long)p_Var10 + -1) = false;
          bVar3 = piece_picker::is_piece_finished(_Var2._M_head_impl,pVar14);
          if (bVar3) {
            _Var2._M_head_impl =
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
            *(bool *)((long)p_Var10 + -8) = true;
            *(bool *)((long)p_Var10 + -7) = true;
            *(bool *)((long)p_Var10 + -6) = true;
            *(bool *)((long)p_Var10 + -5) = false;
            *(bool *)((long)p_Var10 + -4) = false;
            *(bool *)((long)p_Var10 + -3) = false;
            *(bool *)((long)p_Var10 + -2) = false;
            *(bool *)((long)p_Var10 + -1) = false;
            bVar3 = piece_picker::has_piece_passed(_Var2._M_head_impl,pVar14);
            if (!bVar3) {
              _Var2._M_head_impl =
                   (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
              *(bool *)((long)p_Var10 + -8) = true;
              *(bool *)((long)p_Var10 + -7) = true;
              *(bool *)((long)p_Var10 + -6) = true;
              *(bool *)((long)p_Var10 + -5) = false;
              *(bool *)((long)p_Var10 + -4) = false;
              *(bool *)((long)p_Var10 + -3) = false;
              *(bool *)((long)p_Var10 + -2) = false;
              *(bool *)((long)p_Var10 + -1) = false;
              piece_picker::we_have(_Var2._M_head_impl,pVar14);
              *(bool *)((long)p_Var10 + -8) = true;
              *(bool *)((long)p_Var10 + -7) = true;
              *(bool *)((long)p_Var10 + -6) = true;
              *(bool *)((long)p_Var10 + -5) = false;
              *(bool *)((long)p_Var10 + -4) = false;
              *(bool *)((long)p_Var10 + -3) = false;
              *(bool *)((long)p_Var10 + -2) = false;
              *(bool *)((long)p_Var10 + -1) = false;
              update_gauge(this);
              *(bool *)((long)p_Var10 + -8) = true;
              *(bool *)((long)p_Var10 + -7) = true;
              *(bool *)((long)p_Var10 + -6) = true;
              *(bool *)((long)p_Var10 + -5) = false;
              *(bool *)((long)p_Var10 + -4) = false;
              *(bool *)((long)p_Var10 + -3) = false;
              *(bool *)((long)p_Var10 + -2) = false;
              *(bool *)((long)p_Var10 + -1) = false;
              we_have(this,pVar14,false);
            }
          }
        }
      }
    }
  }
  if (sVar17.status == piece_hash_failed) {
    iVar6 = sVar17.first_verified_block / iVar5;
    for (iVar11 = 0; sVar17.num_verified / iVar5 != iVar11; iVar11 = iVar11 + 1) {
      _Var2._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if ((_Var2._M_head_impl != (piece_picker *)0x0) && (-iVar6 != iVar11)) {
        pVar14.m_val = piece.m_val + iVar6 + iVar11;
        *(bool *)((long)p_Var10 + -8) = true;
        *(bool *)((long)p_Var10 + -7) = true;
        *(bool *)((long)p_Var10 + -6) = true;
        *(bool *)((long)p_Var10 + -5) = false;
        *(bool *)((long)p_Var10 + -4) = false;
        *(bool *)((long)p_Var10 + -3) = false;
        *(bool *)((long)p_Var10 + -2) = false;
        *(bool *)((long)p_Var10 + -1) = false;
        piece_picker::we_dont_have(_Var2._M_head_impl,pVar14);
        *(bool *)((long)p_Var10 + -8) = true;
        *(bool *)((long)p_Var10 + -7) = true;
        *(bool *)((long)p_Var10 + -6) = true;
        *(bool *)((long)p_Var10 + -5) = false;
        *(bool *)((long)p_Var10 + -4) = false;
        *(bool *)((long)p_Var10 + -3) = false;
        *(bool *)((long)p_Var10 + -2) = false;
        *(bool *)((long)p_Var10 + -1) = false;
        update_gauge(this);
        local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(bool *)((long)p_Var10 + -8) = true;
        *(bool *)((long)p_Var10 + -7) = true;
        *(bool *)((long)p_Var10 + -6) = true;
        *(bool *)((long)p_Var10 + -5) = false;
        *(bool *)((long)p_Var10 + -4) = false;
        *(bool *)((long)p_Var10 + -3) = false;
        *(bool *)((long)p_Var10 + -2) = false;
        *(bool *)((long)p_Var10 + -1) = false;
        piece_failed(this,pVar14,(vector<int,_std::allocator<int>_> *)&local_c8);
        *(bool *)((long)p_Var10 + -8) = true;
        *(bool *)((long)p_Var10 + -7) = true;
        *(bool *)((long)p_Var10 + -6) = true;
        *(bool *)((long)p_Var10 + -5) = false;
        *(bool *)((long)p_Var10 + -4) = false;
        *(bool *)((long)p_Var10 + -3) = false;
        *(bool *)((long)p_Var10 + -2) = false;
        *(bool *)((long)p_Var10 + -1) = false;
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
      }
    }
LAB_002d5e5a:
    local_48 = false_value;
    goto LAB_002d5e5c;
  }
  if (local_48 != indeterminate_value) goto LAB_002d5e5c;
  pbVar7 = pbVar7 + 1;
  for (lVar9 = (long)pbVar16 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
    if (pbVar7[-1] != true) {
      pbVar8 = pbVar7 + -1;
      goto LAB_002d5ee9;
    }
    pbVar8 = pbVar7;
    if (*pbVar7 != true) goto LAB_002d5ee9;
    if (pbVar7[1] != true) {
      pbVar8 = pbVar7 + 1;
      goto LAB_002d5ee9;
    }
    if (pbVar7[2] != true) {
      pbVar8 = pbVar7 + 2;
      goto LAB_002d5ee9;
    }
    pbVar7 = pbVar7 + 4;
    pbVar16 = pbVar16 + -4;
  }
  pbVar8 = pbVar7 + -1;
  if (pbVar16 == (bool *)0x1) {
LAB_002d5f05:
    if (*pbVar8 == false) goto LAB_002d5ee9;
LAB_002d5f0a:
    *(bool *)((long)p_Var10 + -8) = true;
    *(bool *)((long)p_Var10 + -7) = false;
    *(bool *)((long)p_Var10 + -6) = false;
    *(bool *)((long)p_Var10 + -5) = false;
    *(bool *)((long)p_Var10 + -4) = false;
    *(bool *)((long)p_Var10 + -3) = false;
    *(bool *)((long)p_Var10 + -2) = false;
    *(bool *)((long)p_Var10 + -1) = false;
  }
  else {
    if (pbVar16 == (bool *)0x3) {
      if (*pbVar8 == true) goto LAB_002d5ef8;
    }
    else {
      pbVar7 = pbVar8;
      if (pbVar16 != (bool *)0x2) goto LAB_002d5f0a;
LAB_002d5ef8:
      pbVar8 = pbVar7;
      if (*pbVar8 == true) {
        pbVar8 = pbVar8 + 1;
        goto LAB_002d5f05;
      }
    }
LAB_002d5ee9:
    if (pbVar8 == pbVar1) goto LAB_002d5f0a;
    *(bool *)((long)p_Var10 + -8) = true;
    *(bool *)((long)p_Var10 + -7) = false;
    *(bool *)((long)p_Var10 + -6) = false;
    *(bool *)((long)p_Var10 + -5) = false;
    *(bool *)((long)p_Var10 + -4) = false;
    *(bool *)((long)p_Var10 + -3) = false;
    *(bool *)((long)p_Var10 + -2) = false;
    *(bool *)((long)p_Var10 + -1) = false;
  }
  local_48 = (value_t)*(undefined8 *)((long)p_Var10 + -8);
LAB_002d5e5c:
  *(bool *)((long)p_Var10 + -8) = true;
  *(bool *)((long)p_Var10 + -7) = true;
  *(bool *)((long)p_Var10 + -6) = true;
  *(bool *)((long)p_Var10 + -5) = false;
  *(bool *)((long)p_Var10 + -4) = false;
  *(bool *)((long)p_Var10 + -3) = false;
  *(bool *)((long)p_Var10 + -2) = false;
  *(bool *)((long)p_Var10 + -1) = false;
  alloca_destructor<bool>::~alloca_destructor((alloca_destructor<bool> *)local_a8);
  return (tribool)local_48;
}

Assistant:

boost::tribool torrent::on_blocks_hashed(piece_index_t const piece
		, span<sha256_hash const> const block_hashes)
	{
		boost::tribool ret = boost::indeterminate;
		need_hash_picker();

		int const blocks_in_piece = torrent_file().orig_files().blocks_in_piece2(piece);
		int const blocks_per_piece = torrent_file().blocks_per_piece();

		// the blocks are guaranteed to represent exactly one piece
		TORRENT_ASSERT(blocks_in_piece == int(block_hashes.size()));

		TORRENT_ALLOCA(block_passed, bool, blocks_in_piece);
		std::fill(block_passed.begin(), block_passed.end(), false);

		auto last_result = set_block_hash_result(set_block_hash_result::result::unknown);

		for (int i = 0; i < blocks_in_piece; ++i)
		{
			// if there was an enoent or eof error the block hashes array may be incomplete
			// bail if we've hit the end of the valid hashes
			if (block_hashes[i].is_all_zeros()) return false;

			auto const result = get_hash_picker().set_block_hash(piece
				, i * default_block_size, block_hashes[i]);
			last_result = result;

			// all verified ranges should always be full pieces or less
			TORRENT_ASSERT(result.first_verified_block >= 0
				|| (result.first_verified_block % blocks_per_piece) == 0);
			TORRENT_ASSERT(result.num_verified <= blocks_per_piece
				|| (result.num_verified % blocks_per_piece) == 0);

			if (result.status == set_block_hash_result::result::success)
			{
				TORRENT_ASSERT(result.first_verified_block < blocks_in_piece);
				TORRENT_ASSERT(blocks_in_piece <= blocks_per_piece);

				// note that result.num_verified may cover pad blocks too, and
				// so may be > blocks_in_piece

				// sometimes, completing a single block may "unlock" validating
				// multiple pieces. e.g. if we don't have the piece layer yet,
				// but we completed the last block in the whole torrent, now we
				// can validate everything. For this reason,
				// first_verified_block may be negative.

				// In this call, we track the blocks in this piece though, in
				// the block_passed array. For that tracking we need to clamp
				// the start index to 0.
				auto const first_block = std::max(0, result.first_verified_block);
				auto const count = std::min(blocks_in_piece - first_block, result.num_verified);
				std::fill_n(block_passed.begin() + first_block, count, true);

				// the current block (i) should be part of the range that was
				// verified
				TORRENT_ASSERT(first_block <= i);
				TORRENT_ASSERT(i < first_block + count);

				// if the hashes for more than one piece have been verified,
				// check for any pieces which were already checked but couldn't
				// be verified and mark them as verified
				for (piece_index_t verified_piece : result.piece_range(piece, blocks_per_piece))
				{
					if (!has_picker()
						|| verified_piece == piece
						|| !m_picker->is_piece_finished(verified_piece)
						|| m_picker->has_piece_passed(verified_piece))
						continue;

					TORRENT_ASSERT(get_hash_picker().piece_verified(verified_piece));
					m_picker->we_have(verified_piece);
					update_gauge();
					we_have(verified_piece);
				}
			}
			else if (result.status == set_block_hash_result::result::block_hash_failed)
			{
				ret = false;
			}
		}
		if (last_result.status == set_block_hash_result::result::piece_hash_failed)
		{
			// only if the *last* block causes the piece to fail, do we know
			// it actually failed. Otherwise it might have been failing
			// because of other, previously existing block hashes.
			ret = false;

			// if the hashes for more than one piece have been verified,
			// check for any pieces which were already checked but couldn't
			// be verified and mark them as verified
			for (piece_index_t verified_piece : last_result.piece_range(piece, blocks_per_piece))
			{
				if (!has_picker()
					|| verified_piece == piece)
					continue;

				m_picker->we_dont_have(verified_piece);
				update_gauge();
				piece_failed(verified_piece);
			}
		}

		if (boost::indeterminate(ret) && std::all_of(block_passed.begin(), block_passed.end()
			, [](bool e) { return e; }))
		{
			ret = true;
		}
		return ret;
	}